

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

set<int,_std::less<int>,_std::allocator<int>_> *
wallet::InterpretSubtractFeeFromOutputInstructions
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          UniValue *sffo_instructions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *destinations)

{
  _Rb_tree_header *p_Var1;
  pointer pUVar2;
  pointer pbVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  VType VVar6;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar7;
  string *psVar8;
  UniValue *pUVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  pointer this;
  long in_FS_OFFSET;
  int pos;
  int local_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (sffo_instructions->typ != VNULL) {
    if (sffo_instructions->typ == VBOOL) {
      bVar4 = UniValue::get_bool(sffo_instructions);
      if (bVar4) {
        local_58._M_dataplus._M_p._0_4_ = 0;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&__return_storage_ptr__->_M_t,(int *)&local_58);
      }
    }
    else {
      pvVar7 = UniValue::getValues(sffo_instructions);
      pUVar2 = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (this = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
        VVar6 = this->typ;
        if (VVar6 == VSTR) {
          if ((destinations->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish !=
              (destinations->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
            lVar14 = 8;
            uVar12 = 0;
            do {
              psVar8 = UniValue::get_str_abi_cxx11_(this);
              pbVar3 = (destinations->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar13 = (long)(destinations->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
              if (uVar13 <= uVar12) {
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_002c04c1;
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12,uVar13);
                goto LAB_002c02f3;
              }
              __n = psVar8->_M_string_length;
              if ((__n == *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar14)) &&
                 ((__n == 0 ||
                  (iVar5 = bcmp((psVar8->_M_dataplus)._M_p,*(void **)((long)pbVar3 + lVar14 + -8),
                                __n), iVar5 == 0)))) {
                local_58._M_dataplus._M_p._0_4_ = (undefined4)uVar12;
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>(&__return_storage_ptr__->_M_t,(int *)&local_58);
                break;
              }
              uVar12 = uVar12 + 1;
              lVar14 = lVar14 + 0x20;
            } while (uVar12 < uVar13);
          }
          VVar6 = this->typ;
        }
        if (VVar6 == VNUM) {
          local_5c = UniValue::getInt<int>(this);
          p_Var10 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          p_Var11 = &p_Var1->_M_header;
          if (p_Var10 != (_Base_ptr)0x0) {
            do {
              if (local_5c <= (int)*(size_t *)(p_Var10 + 1)) {
                p_Var11 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < local_5c];
            } while (p_Var10 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
               ((int)((_Rb_tree_header *)p_Var11)->_M_node_count <= local_5c)) {
              pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
              tinyformat::format<int>
                        (&local_58,"Invalid parameter, duplicated position: %d",&local_5c);
              JSONRPCError(pUVar9,-8,&local_58);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pUVar9,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_002c04c1;
            }
          }
          if (local_5c < 0) {
            pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, negative position: %d",&local_5c);
            JSONRPCError(pUVar9,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar9,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_002c04c1;
          }
          if ((int)((ulong)((long)(destinations->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(destinations->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5) <= local_5c) {
LAB_002c02f3:
            pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, position too large: %d",&local_5c)
            ;
            JSONRPCError(pUVar9,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar9,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_002c04c1;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     __return_storage_ptr__,&local_5c);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002c04c1:
  __stack_chk_fail();
}

Assistant:

std::set<int> InterpretSubtractFeeFromOutputInstructions(const UniValue& sffo_instructions, const std::vector<std::string>& destinations)
{
    std::set<int> sffo_set;
    if (sffo_instructions.isNull()) return sffo_set;
    if (sffo_instructions.isBool()) {
        if (sffo_instructions.get_bool()) sffo_set.insert(0);
        return sffo_set;
    }
    for (const auto& sffo : sffo_instructions.getValues()) {
        if (sffo.isStr()) {
            for (size_t i = 0; i < destinations.size(); ++i) {
                if (sffo.get_str() == destinations.at(i)) {
                    sffo_set.insert(i);
                    break;
                }
            }
        }
        if (sffo.isNum()) {
            int pos = sffo.getInt<int>();
            if (sffo_set.contains(pos))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, duplicated position: %d", pos));
            if (pos < 0)
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, negative position: %d", pos));
            if (pos >= int(destinations.size()))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, position too large: %d", pos));
            sffo_set.insert(pos);
        }
    }
    return sffo_set;
}